

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

string * __thiscall helics::ActionMessage::packetize_json_abi_cxx11_(ActionMessage *this)

{
  size_type sVar1;
  long lVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unsigned_long dsz;
  string *data;
  ActionMessage *in_stack_00000398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined7 in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff97;
  size_type in_stack_ffffffffffffff98;
  const_iterator __p;
  undefined1 local_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  
  __p._M_current = (char *)in_RDI;
  to_json_string_abi_cxx11_(in_stack_00000398);
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __p._M_current);
  lVar2 = sVar1 + 4;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            (in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (in_RDI,__p,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
  uStack_1e = (value_type)((ulong)lVar2 >> 0x10);
  pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      (size_type)in_stack_ffffffffffffff68);
  *pvVar3 = uStack_1e;
  uStack_1f = (value_type)((ulong)lVar2 >> 8);
  pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      (size_type)in_stack_ffffffffffffff68);
  *pvVar3 = uStack_1f;
  local_20 = (value_type)lVar2;
  pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(local_20,in_stack_ffffffffffffff70),
                      (size_type)in_stack_ffffffffffffff68);
  *pvVar3 = local_20;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uStack_1f,in_stack_ffffffffffffff80),(char)((ulong)pvVar3 >> 0x38));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uStack_1f,in_stack_ffffffffffffff80),(char)((ulong)pvVar3 >> 0x38));
  return (string *)in_RDI;
}

Assistant:

std::string ActionMessage::packetize_json() const
{
    std::string data = to_json_string();
    auto dsz = data.size() + sizeof(uint32_t);
    data.insert(data.begin(), 4, LEADING_CHAR);
    data[1] = static_cast<char>(((dsz >> 16U) & 0xFFU));
    data[2] = static_cast<char>(((dsz >> 8U) & 0xFFU));
    data[3] = static_cast<char>(dsz & 0xFFU);
    data.push_back(TAIL_CHAR1);
    data.push_back(TAIL_CHAR2);
    return data;
}